

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O0

size_t ZSTD_compressBlock_opt2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 ZSTD_dictMode_e dictMode)

{
  undefined1 (*pauVar1) [20];
  byte bVar2;
  int iVar3;
  uint litLength;
  uint matchLength;
  U32 *pUVar4;
  ZSTD_match_t *matches_00;
  ZSTD_optimal_t sol;
  ZSTD_optimal_t sol_00;
  ZSTD_optimal_t sol_01;
  ZSTD_optimal_t sol_02;
  ZSTD_optimal_t sol_03;
  undefined1 auVar5 [20];
  U32 UVar6;
  U32 UVar7;
  int iVar8;
  U32 UVar9;
  U32 UVar10;
  uint uVar11;
  BYTE *pBVar12;
  U32 *pUVar13;
  U32 *pUVar14;
  repcodes_t rVar15;
  undefined8 in_stack_fffffffffffffc64;
  uint local_38c;
  uint local_384;
  U32 local_37c;
  U32 local_370;
  U32 local_364;
  uint local_35c;
  U32 local_354;
  U32 local_34c;
  U32 local_33c;
  U32 local_338;
  U32 local_32c;
  U32 local_320;
  U32 local_318;
  ZSTD_dictMode_e dictMode_local;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  U32 advance;
  U32 offBase_1;
  U32 mlen_1;
  U32 llen;
  U32 storePos;
  uint local_2ac;
  U32 backDist;
  U32 seqPos;
  U32 storeStart;
  U32 storeEnd;
  U32 local_298;
  repcodes_t reps;
  int price_2;
  U32 pos_1;
  U32 mlen;
  U32 startML;
  U32 lastML;
  U32 offset;
  U32 maxML_1;
  U32 matchNb_1;
  U32 nbMatches_1;
  U32 basePrice;
  U32 previousPrice;
  U32 litlen_2;
  U32 ll0_1;
  U32 local_248;
  undefined8 local_240;
  repcodes_t newReps;
  U32 prev;
  int price_1;
  U32 litlen_1;
  BYTE *inr;
  U32 sequencePrice;
  U32 matchPrice;
  U32 end;
  U32 offBase;
  U32 matchNb;
  U32 pos;
  U32 literalsPrice;
  U32 maxOffBase;
  U32 maxML;
  U32 i;
  U32 nbMatches;
  U32 ll0;
  U32 litlen;
  U32 last_pos;
  U32 cur;
  ZSTD_optLdm_t optLdm;
  ZSTD_optimal_t lastSequence;
  ZSTD_match_t *matches;
  ZSTD_optimal_t *opt;
  U32 local_170;
  U32 nextToUpdate3;
  U32 minMatch;
  U32 sufficient_len;
  ZSTD_getAllMatchesFn getAllMatches;
  ZSTD_compressionParameters *cParams;
  BYTE *prefixStart;
  BYTE *base;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  optState_t *optStatePtr;
  size_t local_110;
  BYTE *local_108;
  U32 *local_100;
  seqStore_t *local_f8;
  ZSTD_matchState_t *local_f0;
  U32 local_e4;
  U32 local_e0;
  U32 mlCode;
  U32 mlBase;
  U32 offCode;
  U32 price;
  U32 local_c8;
  U32 local_c4;
  U32 local_c0;
  U32 local_bc;
  U32 local_b8;
  U32 mlCode_1;
  U32 mlBase_1;
  U32 offCode_1;
  U32 price_3;
  uint local_9c;
  U32 local_98;
  U32 local_94;
  BYTE *local_90;
  size_t mlBase_2;
  BYTE *litEnd;
  BYTE *litLimit_w;
  U32 local_6c;
  BYTE *local_68;
  BYTE *local_60;
  ulong local_58;
  seqStore_t *local_50;
  BYTE *local_48;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  long local_20;
  BYTE *local_18;
  BYTE *local_10;
  
  optStatePtr._4_4_ = 2;
  istart = (BYTE *)&ms->opt;
  ilimit = (BYTE *)((long)src + srcSize);
  base = ilimit + -8;
  prefixStart = (ms->window).base;
  cParams = (ZSTD_compressionParameters *)(prefixStart + (ms->window).dictLimit);
  getAllMatches = (ZSTD_getAllMatchesFn)&ms->cParams;
  iend = (BYTE *)src;
  anchor = (BYTE *)src;
  ip = (BYTE *)src;
  optStatePtr._0_4_ = dictMode;
  local_110 = srcSize;
  local_108 = (BYTE *)src;
  local_100 = rep;
  local_f8 = seqStore;
  local_f0 = ms;
  _minMatch = ZSTD_selectBtGetAllMatches(ms,dictMode);
  if (*(uint *)(getAllMatches + 0x14) < 0xfff) {
    local_318 = *(U32 *)(getAllMatches + 0x14);
  }
  else {
    local_318 = 0xfff;
  }
  nextToUpdate3 = local_318;
  local_170 = 4;
  if (*(int *)(getAllMatches + 0x10) == 3) {
    local_170 = 3;
  }
  opt._4_4_ = local_f0->nextToUpdate;
  pUVar4 = *(U32 **)(istart + 0x28);
  matches_00 = *(ZSTD_match_t **)(istart + 0x20);
  memset(&optLdm.offset,0,0x1c);
  if (local_f0->ldmSeqStore == (rawSeqStore_t *)0x0) {
    memcpy(&last_pos,&kNullRawSeqStore,0x28);
  }
  else {
    memcpy(&last_pos,local_f0->ldmSeqStore,0x28);
  }
  optLdm.startPosInBlock = 0;
  optLdm.seqStore.capacity._0_4_ = 0;
  optLdm.seqStore.capacity._4_4_ = 0;
  ZSTD_opt_getNextMatchAndUpdateSeqStore
            ((ZSTD_optLdm_t *)&last_pos,(int)anchor - (int)ip,(int)ilimit - (int)anchor);
  if (2 < (int)optStatePtr._4_4_) {
    __assert_fail("optLevel <= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x44a,
                  "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                 );
  }
  ZSTD_rescaleFreqs((optState_t *)istart,local_108,local_110,optStatePtr._4_4_);
  anchor = anchor + (int)(uint)((ZSTD_compressionParameters *)anchor == cParams);
  do {
    while( true ) {
      if (base <= anchor) {
        return (long)ilimit - (long)iend;
      }
      ll0 = 0;
      nbMatches = (int)anchor - (int)iend;
      i = (U32)((nbMatches != 0 ^ 0xffU) & 1);
      maxML = (*_minMatch)(matches_00,local_f0,(U32 *)((long)&opt + 4),anchor,ilimit,local_100,i,
                           local_170);
      ZSTD_optLdm_processMatchCandidate
                ((ZSTD_optLdm_t *)&last_pos,matches_00,&maxML,(int)anchor - (int)ip,
                 (int)ilimit - (int)anchor);
      if (maxML != 0) break;
      anchor = anchor + 1;
    }
    for (maxOffBase = 0; maxOffBase < 3; maxOffBase = maxOffBase + 1) {
      pUVar4[(ulong)maxOffBase + 4] = local_100[maxOffBase];
    }
    pUVar4[2] = 0;
    pUVar4[3] = nbMatches;
    UVar6 = ZSTD_litLengthPrice(nbMatches,(optState_t *)istart,optStatePtr._4_4_);
    *pUVar4 = UVar6;
    lastSequence.price = matches_00[maxML - 1].len;
    if (nextToUpdate3 < (uint)lastSequence.price) {
      lastSequence.off = nbMatches;
      optLdm._52_4_ = matches_00[maxML - 1].off;
      litlen = 0;
      sol.off = nbMatches;
      sol.price = lastSequence.price;
      sol.mlen = lastSequence.mlen;
      sol.litlen = lastSequence.litlen;
      sol.rep[0] = lastSequence.rep[0];
      sol.rep[1] = (int)in_stack_fffffffffffffc64;
      sol.rep[2] = (int)((ulong)in_stack_fffffffffffffc64 >> 0x20);
      ll0 = ZSTD_totalLen(sol);
    }
    else {
      if ((int)*pUVar4 < 0) {
        __assert_fail("opt[0].price >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x477,
                      "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                     );
      }
      UVar6 = *pUVar4;
      UVar7 = ZSTD_litLengthPrice(0,(optState_t *)istart,optStatePtr._4_4_);
      for (offBase = 1; offBase < local_170; offBase = offBase + 1) {
        pUVar4[(ulong)offBase * 7] = 0x40000000;
      }
      for (end = 0; end < maxML; end = end + 1) {
        UVar9 = matches_00[end].off;
        uVar11 = matches_00[end].len;
        for (; offBase <= uVar11; offBase = offBase + 1) {
          local_c8 = offBase;
          _price = istart;
          offCode = optStatePtr._4_4_;
          local_c4 = UVar9;
          mlCode = ZSTD_highbit32(UVar9);
          local_e0 = local_c8 - 3;
          if (local_c8 < 3) {
            __assert_fail("matchLength >= MINMATCH",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                          ,0x148,
                          "U32 ZSTD_getMatchPrice(const U32, const U32, const optState_t *const, const int)"
                         );
          }
          if (*(int *)(_price + 0x50) == 1) {
            if (offCode == 0) {
              local_320 = ZSTD_bitWeight(local_e0);
            }
            else {
              local_320 = ZSTD_fracWeight(local_e0);
            }
            local_c0 = local_320 + (mlCode + 0x10) * 0x100;
          }
          else {
            iVar8 = mlCode * 0x100;
            iVar3 = *(int *)(_price + 0x4c);
            if (offCode == 0) {
              local_32c = ZSTD_bitWeight(*(U32 *)(*(long *)(_price + 0x18) + (ulong)mlCode * 4));
            }
            else {
              local_32c = ZSTD_fracWeight(*(U32 *)(*(long *)(_price + 0x18) + (ulong)mlCode * 4));
            }
            mlBase = iVar8 + (iVar3 - local_32c);
            if (((int)offCode < 2) && (0x13 < mlCode)) {
              mlBase = (mlCode - 0x13) * 0x200 + mlBase;
            }
            local_e4 = ZSTD_MLcode(local_e0);
            bVar2 = ""[local_e4];
            iVar3 = *(int *)(_price + 0x48);
            if (offCode == 0) {
              local_338 = ZSTD_bitWeight(*(U32 *)(*(long *)(_price + 0x10) + (ulong)local_e4 * 4));
            }
            else {
              local_338 = ZSTD_fracWeight(*(U32 *)(*(long *)(_price + 0x10) + (ulong)local_e4 * 4));
            }
            mlBase = (uint)bVar2 * 0x100 + (iVar3 - local_338) + mlBase + 0x33;
            local_c0 = mlBase;
          }
          pUVar4[(ulong)offBase * 7 + 2] = offBase;
          pUVar4[(ulong)offBase * 7 + 1] = UVar9;
          pUVar4[(ulong)offBase * 7 + 3] = nbMatches;
          pUVar4[(ulong)offBase * 7] = UVar6 + UVar7 + local_c0;
        }
      }
      ll0 = offBase - 1;
      for (litlen = 1; litlen <= ll0; litlen = litlen + 1) {
        pBVar12 = anchor + litlen;
        if (0xfff < litlen) {
          __assert_fail("cur < ZSTD_OPT_NUM",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                        ,0x492,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        if (pUVar4[(ulong)(litlen - 1) * 7 + 2] == 0) {
          local_33c = pUVar4[(ulong)(litlen - 1) * 7 + 3] + 1;
        }
        else {
          local_33c = 1;
        }
        UVar6 = pUVar4[(ulong)(litlen - 1) * 7];
        UVar7 = ZSTD_rawLiteralsCost
                          (anchor + ((ulong)litlen - 1),1,(optState_t *)istart,optStatePtr._4_4_);
        UVar9 = ZSTD_litLengthPrice(local_33c,(optState_t *)istart,optStatePtr._4_4_);
        UVar10 = ZSTD_litLengthPrice(local_33c - 1,(optState_t *)istart,optStatePtr._4_4_);
        newReps.rep[2] = (UVar6 + UVar7 + UVar9) - UVar10;
        if (999999999 < (int)newReps.rep[2]) {
          __assert_fail("price < 1000000000",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                        ,0x49b,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        if ((int)newReps.rep[2] <= (int)pUVar4[(ulong)litlen * 7]) {
          pUVar4[(ulong)litlen * 7 + 2] = 0;
          pUVar4[(ulong)litlen * 7 + 1] = 0;
          pUVar4[(ulong)litlen * 7 + 3] = local_33c;
          pUVar4[(ulong)litlen * 7] = newReps.rep[2];
        }
        if (litlen < pUVar4[(ulong)litlen * 7 + 2]) {
          __assert_fail("cur >= opt[cur].mlen",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                        ,0x4b1,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        if (pUVar4[(ulong)litlen * 7 + 2] == 0) {
          *(undefined8 *)(pUVar4 + (ulong)litlen * 7 + 4) =
               *(undefined8 *)(pUVar4 + (ulong)(litlen - 1) * 7 + 4);
          pUVar4[(ulong)litlen * 7 + 6] = pUVar4[(ulong)(litlen - 1) * 7 + 6];
        }
        else {
          newReps.rep[1] = litlen - pUVar4[(ulong)litlen * 7 + 2];
          _litlen_2 = ZSTD_newRep(pUVar4 + (ulong)newReps.rep[1] * 7 + 4,
                                  pUVar4[(ulong)litlen * 7 + 1],
                                  (uint)(pUVar4[(ulong)litlen * 7 + 3] == 0));
          local_240 = _litlen_2;
          newReps.rep[0] = local_248;
          *(undefined8 *)(pUVar4 + (ulong)litlen * 7 + 4) = _litlen_2;
          pUVar4[(ulong)litlen * 7 + 6] = local_248;
        }
        if (pBVar12 <= base) {
          if (litlen == ll0) break;
          if ((optStatePtr._4_4_ != 0) ||
             ((int)(pUVar4[(ulong)litlen * 7] + 0x80) < (int)pUVar4[(ulong)(litlen + 1) * 7])) {
            if ((int)pUVar4[(ulong)litlen * 7] < 0) {
              __assert_fail("opt[cur].price >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                            ,0x4c5,
                            "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                           );
            }
            previousPrice = (U32)(pUVar4[(ulong)litlen * 7 + 2] != 0);
            if (pUVar4[(ulong)litlen * 7 + 2] == 0) {
              local_34c = pUVar4[(ulong)litlen * 7 + 3];
            }
            else {
              local_34c = 0;
            }
            basePrice = local_34c;
            UVar6 = pUVar4[(ulong)litlen * 7];
            nbMatches_1 = UVar6;
            UVar7 = ZSTD_litLengthPrice(0,(optState_t *)istart,optStatePtr._4_4_);
            matchNb_1 = UVar6 + UVar7;
            maxML_1 = (*_minMatch)(matches_00,local_f0,(U32 *)((long)&opt + 4),pBVar12,ilimit,
                                   pUVar4 + (ulong)litlen * 7 + 4,previousPrice,local_170);
            ZSTD_optLdm_processMatchCandidate
                      ((ZSTD_optLdm_t *)&last_pos,matches_00,&maxML_1,(int)pBVar12 - (int)ip,
                       (int)ilimit - (int)pBVar12);
            if (maxML_1 != 0) {
              lastSequence.price = matches_00[maxML_1 - 1].len;
              if ((nextToUpdate3 < (uint)lastSequence.price) ||
                 (0xfff < litlen + lastSequence.price)) {
                optLdm._52_4_ = matches_00[maxML_1 - 1].off;
                lastSequence.off = basePrice;
                if (pUVar4[(ulong)litlen * 7 + 2] == 0) {
                  local_354 = pUVar4[(ulong)litlen * 7 + 3];
                }
                else {
                  local_354 = 0;
                }
                local_354 = litlen - local_354;
                sol_00.off = basePrice;
                sol_00.price = lastSequence.price;
                sol_00.mlen = lastSequence.mlen;
                sol_00.litlen = lastSequence.litlen;
                sol_00.rep[0] = lastSequence.rep[0];
                sol_00.rep[1] = (int)in_stack_fffffffffffffc64;
                sol_00.rep[2] = (int)((ulong)in_stack_fffffffffffffc64 >> 0x20);
                litlen = local_354;
                UVar6 = ZSTD_totalLen(sol_00);
                ll0 = local_354 + UVar6;
                if (0x1000 < litlen) {
                  litlen = 0;
                }
                goto LAB_003ea2fb;
              }
              for (offset = 0; offset < maxML_1; offset = offset + 1) {
                UVar6 = matches_00[offset].off;
                price_2 = matches_00[offset].len;
                if (offset == 0) {
                  local_35c = local_170;
                }
                else {
                  local_35c = matches_00[offset - 1].len + 1;
                }
                for (; UVar7 = matchNb_1, local_35c <= (uint)price_2; price_2 = price_2 + -1) {
                  uVar11 = litlen + price_2;
                  local_9c = price_2;
                  _price_3 = istart;
                  offCode_1 = optStatePtr._4_4_;
                  local_98 = UVar6;
                  mlCode_1 = ZSTD_highbit32(UVar6);
                  local_b8 = local_9c - 3;
                  if (local_9c < 3) {
                    __assert_fail("matchLength >= MINMATCH",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                                  ,0x148,
                                  "U32 ZSTD_getMatchPrice(const U32, const U32, const optState_t *const, const int)"
                                 );
                  }
                  if (*(int *)(_price_3 + 0x50) == 1) {
                    if (offCode_1 == 0) {
                      local_364 = ZSTD_bitWeight(local_b8);
                    }
                    else {
                      local_364 = ZSTD_fracWeight(local_b8);
                    }
                    local_94 = local_364 + (mlCode_1 + 0x10) * 0x100;
                  }
                  else {
                    iVar8 = mlCode_1 * 0x100;
                    iVar3 = *(int *)(_price_3 + 0x4c);
                    if (offCode_1 == 0) {
                      local_370 = ZSTD_bitWeight(*(U32 *)(*(long *)(_price_3 + 0x18) +
                                                         (ulong)mlCode_1 * 4));
                    }
                    else {
                      local_370 = ZSTD_fracWeight(*(U32 *)(*(long *)(_price_3 + 0x18) +
                                                          (ulong)mlCode_1 * 4));
                    }
                    mlBase_1 = iVar8 + (iVar3 - local_370);
                    if (((int)offCode_1 < 2) && (0x13 < mlCode_1)) {
                      mlBase_1 = (mlCode_1 - 0x13) * 0x200 + mlBase_1;
                    }
                    local_bc = ZSTD_MLcode(local_b8);
                    bVar2 = ""[local_bc];
                    iVar3 = *(int *)(_price_3 + 0x48);
                    if (offCode_1 == 0) {
                      local_37c = ZSTD_bitWeight(*(U32 *)(*(long *)(_price_3 + 0x10) +
                                                         (ulong)local_bc * 4));
                    }
                    else {
                      local_37c = ZSTD_fracWeight(*(U32 *)(*(long *)(_price_3 + 0x10) +
                                                          (ulong)local_bc * 4));
                    }
                    mlBase_1 = (uint)bVar2 * 0x100 + (iVar3 - local_37c) + mlBase_1 + 0x33;
                    local_94 = mlBase_1;
                  }
                  if ((ll0 < uVar11) || ((int)(UVar7 + local_94) < (int)pUVar4[(ulong)uVar11 * 7]))
                  {
                    for (; ll0 < uVar11; ll0 = ll0 + 1) {
                      pUVar4[(ulong)(ll0 + 1) * 7] = 0x40000000;
                    }
                    pUVar4[(ulong)uVar11 * 7 + 2] = price_2;
                    pUVar4[(ulong)uVar11 * 7 + 1] = UVar6;
                    pUVar4[(ulong)uVar11 * 7 + 3] = basePrice;
                    pUVar4[(ulong)uVar11 * 7] = UVar7 + local_94;
                  }
                  else if (optStatePtr._4_4_ == 0) break;
                }
              }
            }
          }
        }
      }
      UVar6 = ll0;
      pUVar13 = pUVar4 + (ulong)ll0 * 7;
      optLdm.offset = pUVar13[0];
      optLdm._52_4_ = pUVar13[1];
      pauVar1 = (undefined1 (*) [20])(pUVar13 + 2);
      lastSequence.price = *(int *)((long)pauVar1 + 0);
      lastSequence.off = *(U32 *)((long)pauVar1 + 4);
      lastSequence.mlen = pUVar13[4];
      lastSequence.litlen = pUVar13[5];
      lastSequence.rep[0] = pUVar13[6];
      auVar5 = *pauVar1;
      sol_01.rep[1] = (int)in_stack_fffffffffffffc64;
      sol_01.rep[2] = (int)((ulong)in_stack_fffffffffffffc64 >> 0x20);
      sol_01._0_20_ = *pauVar1;
      UVar9 = ZSTD_totalLen(sol_01);
      UVar7 = ll0;
      if (UVar9 < UVar6) {
        sol_02.rep[1] = (int)in_stack_fffffffffffffc64;
        sol_02.rep[2] = (int)((ulong)in_stack_fffffffffffffc64 >> 0x20);
        sol_02._0_20_ = auVar5;
        UVar6 = ZSTD_totalLen(sol_02);
        local_384 = UVar7 - UVar6;
      }
      else {
        local_384 = 0;
      }
      litlen = local_384;
      if (0xfff < local_384) {
        __assert_fail("cur < ZSTD_OPT_NUM",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x504,
                      "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                     );
      }
    }
LAB_003ea2fb:
    if (pUVar4[2] != 0) {
      __assert_fail("opt[0].mlen == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x507,
                    "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                   );
    }
    if (lastSequence.price == 0) {
      *(undefined8 *)local_100 = *(undefined8 *)(pUVar4 + (ulong)litlen * 7 + 4);
      local_100[2] = pUVar4[(ulong)litlen * 7 + 6];
    }
    else {
      rVar15 = ZSTD_newRep(pUVar4 + (ulong)litlen * 7 + 4,optLdm._52_4_,
                           (uint)(lastSequence.off == 0));
      _storeStart = rVar15.rep._0_8_;
      local_298 = rVar15.rep[2];
      *(undefined8 *)local_100 = _storeStart;
      local_100[2] = local_298;
    }
    uVar11 = litlen + 1;
    local_2ac = litlen;
    if (0xfff < uVar11) {
      __assert_fail("storeEnd < ZSTD_OPT_NUM",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x51a,
                    "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                   );
    }
    pUVar13 = pUVar4 + (ulong)uVar11 * 7;
    pUVar13[0] = optLdm.offset;
    pUVar13[1] = optLdm._52_4_;
    pUVar13[2] = lastSequence.price;
    pUVar13[3] = lastSequence.off;
    pUVar13[4] = lastSequence.mlen;
    pUVar13[5] = lastSequence.litlen;
    pUVar13[6] = lastSequence.rep[0];
    backDist = uVar11;
    while (local_2ac != 0) {
      sol_03.rep[1] = (int)in_stack_fffffffffffffc64;
      sol_03.rep[2] = (int)((ulong)in_stack_fffffffffffffc64 >> 0x20);
      sol_03._0_20_ = *(undefined1 (*) [20])(pUVar4 + (ulong)local_2ac * 7 + 2);
      UVar6 = ZSTD_totalLen(sol_03);
      backDist = backDist - 1;
      pUVar13 = pUVar4 + (ulong)backDist * 7;
      pUVar14 = pUVar4 + (ulong)local_2ac * 7;
      *(undefined8 *)pUVar13 = *(undefined8 *)pUVar14;
      *(undefined8 *)(pUVar13 + 2) = *(undefined8 *)(pUVar14 + 2);
      *(undefined8 *)(pUVar13 + 4) = *(undefined8 *)(pUVar14 + 4);
      pUVar13[6] = pUVar14[6];
      if (UVar6 < local_2ac) {
        local_38c = local_2ac - UVar6;
      }
      else {
        local_38c = 0;
      }
      local_2ac = local_38c;
    }
    for (mlen_1 = backDist; mlen_1 <= uVar11; mlen_1 = mlen_1 + 1) {
      litLength = pUVar4[(ulong)mlen_1 * 7 + 3];
      matchLength = pUVar4[(ulong)mlen_1 * 7 + 2];
      UVar6 = pUVar4[(ulong)mlen_1 * 7 + 1];
      if (matchLength == 0) {
        if (mlen_1 != uVar11) {
          __assert_fail("storePos == storeEnd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                        ,0x533,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        anchor = iend + litLength;
      }
      else {
        if (ilimit < iend + litLength) {
          __assert_fail("anchor + llen <= iend",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                        ,0x538,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        ZSTD_updateStats((optState_t *)istart,litLength,iend,UVar6,matchLength);
        local_58 = (ulong)litLength;
        litLimit_w = (BYTE *)(ulong)matchLength;
        local_50 = local_f8;
        local_60 = iend;
        local_68 = ilimit;
        litEnd = ilimit + -0x20;
        mlBase_2 = (size_t)(iend + local_58);
        local_6c = UVar6;
        if (local_f8->maxNbSeq <=
            (ulong)((long)local_f8->sequences - (long)local_f8->sequencesStart >> 3)) {
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_f8->maxNbLit) {
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_f8->litStart + local_f8->maxNbLit < local_f8->lit + local_58) {
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (ilimit < iend + local_58) {
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a1,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (litEnd < mlBase_2) {
          ZSTD_safecopyLiterals(local_f8->lit,iend,(BYTE *)mlBase_2,litEnd);
        }
        else {
          ZSTD_copy16(local_f8->lit,iend);
          if (0x10 < local_58) {
            oend = local_50->lit + 0x10;
            op = local_60 + 0x10;
            local_20 = local_58 - 0x10;
            diff._4_4_ = 0;
            ip_1 = oend + -(long)op;
            local_48 = oend + local_20;
            local_18 = op;
            local_10 = oend;
            if (((long)ip_1 < 0x10) && (-0x10 < (long)ip_1)) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            ZSTD_copy16(oend,op);
            if (0x10 < local_20) {
              oend = oend + 0x10;
              op = op + 0x10;
              do {
                ZSTD_copy16(oend,op);
                oend = oend + 0x10;
                op = op + 0x10;
                ZSTD_copy16(oend,op);
                oend = oend + 0x10;
                op = op + 0x10;
              } while (oend < local_48);
            }
          }
        }
        local_50->lit = local_50->lit + local_58;
        if (0xffff < local_58) {
          if (local_50->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2b2,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_50->longLengthType = ZSTD_llt_literalLength;
          local_50->longLengthPos =
               (U32)((long)local_50->sequences - (long)local_50->sequencesStart >> 3);
        }
        local_50->sequences->litLength = (U16)local_58;
        local_50->sequences->offBase = local_6c;
        if (litLimit_w < (BYTE *)0x3) {
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,700,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        local_90 = litLimit_w + -3;
        if ((BYTE *)0xffff < local_90) {
          if (local_50->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2bf,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_50->longLengthType = ZSTD_llt_matchLength;
          local_50->longLengthPos =
               (U32)((long)local_50->sequences - (long)local_50->sequencesStart >> 3);
        }
        local_50->sequences->mlBase = (U16)local_90;
        local_50->sequences = local_50->sequences + 1;
        iend = iend + (litLength + matchLength);
        anchor = iend;
      }
    }
    ZSTD_setBasePrices((optState_t *)istart,optStatePtr._4_4_);
  } while( true );
}

Assistant:

static size_t ZSTD_compressBlock_opt2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        const void* src, size_t srcSize, const ZSTD_dictMode_e dictMode)
{
    return ZSTD_compressBlock_opt_generic(ms, seqStore, rep, src, srcSize, 2 /* optLevel */, dictMode);
}